

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O2

void DrawerCommandQueue::
     QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
               (int *args,int *args_1,short *args_2)

{
  DrawerCommandQueue *this;
  DrawFogBoundaryLinePalCommand *this_00;
  DrawFogBoundaryLinePalCommand command;
  DrawFogBoundaryLinePalCommand local_a8;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    swrenderer::DrawFogBoundaryLinePalCommand::DrawFogBoundaryLinePalCommand
              (&local_a8,*args,*args_1,(int)*args_2);
    VectoredTryCatch(&local_a8,
                     QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,_int_&,_const_int_&,_short_&>
                     ::anon_class_1_0_00000001::__invoke,
                     QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,_int_&,_const_int_&,_short_&>
                     ::anon_class_1_0_00000001::__invoke);
  }
  else {
    this_00 = (DrawFogBoundaryLinePalCommand *)AllocMemory(0x80);
    if (this_00 == (DrawFogBoundaryLinePalCommand *)0x0) {
      Finish(this);
      this_00 = (DrawFogBoundaryLinePalCommand *)AllocMemory(0x80);
      if (this_00 == (DrawFogBoundaryLinePalCommand *)0x0) {
        return;
      }
    }
    swrenderer::DrawFogBoundaryLinePalCommand::DrawFogBoundaryLinePalCommand
              (this_00,*args,*args_1,(int)*args_2);
    local_a8.super_PalSpanCommand.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
    std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::emplace_back<DrawerCommand*>
              ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,
               (DrawerCommand **)&local_a8);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}